

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::ReturnStmt::set_parent(ReturnStmt *this,IRNode *parent)

{
  FunctionStmtBlock *pFVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  uint32_t width;
  shared_ptr<kratos::AssignStmt> sVar3;
  undefined1 local_38 [8];
  shared_ptr<kratos::AssignStmt> s;
  shared_ptr<kratos::Var> p;
  
  (this->super_Stmt).parent_ = parent;
  pFVar1 = this->func_def_;
  pFVar1->has_return_value_ = true;
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &s.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(pFVar1->function_handler_).
              super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  _Var2 = s.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
  if (_Var2._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pFVar1 = this->func_def_;
    width = (*(((this->value_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_IRNode)._vptr_IRNode[7])();
    FunctionStmtBlock::create_function_handler
              (pFVar1,width,
               ((this->value_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               is_signed_);
  }
  std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &s.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->func_def_->function_handler_).
              super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  sVar3 = Var::assign((Var *)local_38,
                      (shared_ptr<kratos::Var> *)
                      s.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi,(int)this + 200);
  (**(code **)(*(_func_int **)local_38 + 0x38))
            (local_38,this,
             sVar3.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
  return;
}

Assistant:

void ReturnStmt::set_parent(kratos::IRNode *parent) {
    Stmt::set_parent(parent);
    // looping to make sure there is a function statement block
    // it will never be 10k deep. this is to avoid infinite loop when construction failed
    /* comment this out because can only be determined after every statements has been set
     * TODO:
     * add a pass to analysis returns
    }
     */
    func_def_->set_has_return_value(true);
    // need to handle the assignments
    if (!func_def_->function_handler()) {
        // create a function handler
        func_def_->create_function_handler(value_->width(), value_->is_signed());
    }
    auto p = func_def_->function_handler();
    auto s = p->assign(value_, AssignmentType::Blocking);
    s->set_parent(this);
}